

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cfd::core::WallyUtil::GetSupportedMnemonicLanguages_abi_cxx11_(void)

{
  CfdException *this;
  char *wally_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  int ret;
  string lang;
  char *wally_lang;
  int local_8c;
  undefined1 local_88 [32];
  WallyUtil *local_68;
  string local_60;
  string local_40;
  
  local_68 = (WallyUtil *)0x0;
  local_8c = bip39_get_languages((char **)&local_68);
  if (local_8c == 0) {
    ConvertStringAndFree_abi_cxx11_((string *)local_88,local_68,wally_string);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,local_88._0_8_,
               (pointer)(local_88._0_8_ + CONCAT44(local_88._12_4_,local_88._8_4_)));
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,&kMnemonicDelimiter,0x582831);
    StringUtil::Split(in_RDI,&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_);
    }
    return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDI;
  }
  local_88._0_8_ = "cfdcore_wally_util.cpp";
  local_88._8_4_ = 0x11e;
  local_88._16_8_ = "GetSupportedMnemonicLanguages";
  logger::log<int&>((CfdSourceLocation *)local_88,kCfdLogLevelWarning,
                    "Get languages error. ret=[{}]",&local_8c);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_88._0_8_ = local_88 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Get languages error.","");
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_88);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<std::string> WallyUtil::GetSupportedMnemonicLanguages() {
  char* wally_lang = NULL;
  int ret = bip39_get_languages(&wally_lang);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Get languages error. ret=[{}]", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Get languages error.");
  }

  // free and get string
  std::string lang = ConvertStringAndFree(wally_lang);
  return StringUtil::Split(std::string(lang), kMnemonicDelimiter);
}